

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitStringTemplate(ParseNodeStrTemplate *pnodeStrTemplate,ByteCodeGenerator *byteCodeGenerator,
                       FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  RegSlot RVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot R0;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  ParseNodeStr *pPVar6;
  ParseNode *this_00;
  ParseNodePtr this_01;
  ParseNodePtr pPVar7;
  
  if (pnodeStrTemplate->pnodeStringLiterals == (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x231b,"(pnodeStrTemplate->pnodeStringLiterals)",
                       "pnodeStrTemplate->pnodeStringLiterals");
    if (!bVar3) goto LAB_0081ff92;
    *puVar4 = 0;
  }
  if ((pnodeStrTemplate->field_0x2a & 1) == 0) {
    if (pnodeStrTemplate->pnodeSubstitutionExpressions == (ParseNodePtr)0x0) {
      if (pnodeStrTemplate->pnodeStringLiterals->nop == knopList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2324,"(pnodeStrTemplate->pnodeStringLiterals->nop != knopList)",
                           "pnodeStrTemplate->pnodeStringLiterals->nop != knopList");
        if (!bVar3) goto LAB_0081ff92;
        *puVar4 = 0;
      }
      FuncInfo::AcquireLoc(funcInfo,&pnodeStrTemplate->super_ParseNode);
      Emit(pnodeStrTemplate->pnodeStringLiterals,byteCodeGenerator,funcInfo,0,false,false);
      if ((pnodeStrTemplate->super_ParseNode).location ==
          pnodeStrTemplate->pnodeStringLiterals->location) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2329,
                           "(pnodeStrTemplate->location != pnodeStrTemplate->pnodeStringLiterals->location)"
                           ,
                           "pnodeStrTemplate->location != pnodeStrTemplate->pnodeStringLiterals->location"
                          );
        if (!bVar3) goto LAB_0081ff92;
        *puVar4 = 0;
      }
      Js::ByteCodeWriter::Reg2
                (&byteCodeGenerator->m_writer,Ld_A,(pnodeStrTemplate->super_ParseNode).location,
                 pnodeStrTemplate->pnodeStringLiterals->location);
      FuncInfo::ReleaseLoc(funcInfo,pnodeStrTemplate->pnodeStringLiterals);
      return;
    }
    FuncInfo::AcquireLoc(funcInfo,&pnodeStrTemplate->super_ParseNode);
    if (pnodeStrTemplate->pnodeStringLiterals->nop != knopList) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x2334,"(pnodeStrTemplate->pnodeStringLiterals->nop == knopList)",
                         "First string in the list must be a knopList node.");
      if (!bVar3) goto LAB_0081ff92;
      *puVar4 = 0;
    }
    this_00 = pnodeStrTemplate->pnodeStringLiterals;
    pPVar5 = ParseNode::AsParseNodeBin(this_00);
    pPVar6 = ParseNode::AsParseNodeStr(pPVar5->pnode1);
    if (pPVar6->pid->m_cch == 0) {
      bVar3 = true;
    }
    else {
      pPVar5 = ParseNode::AsParseNodeBin(this_00);
      Emit(pPVar5->pnode1,byteCodeGenerator,funcInfo,0,false,false);
      RVar1 = (pnodeStrTemplate->super_ParseNode).location;
      pPVar5 = ParseNode::AsParseNodeBin(this_00);
      if (RVar1 == pPVar5->pnode1->location) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2344,
                           "(pnodeStrTemplate->location != stringNodeList->AsParseNodeBin()->pnode1->location)"
                           ,
                           "pnodeStrTemplate->location != stringNodeList->AsParseNodeBin()->pnode1->location"
                          );
        if (!bVar3) {
LAB_0081ff92:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      RVar1 = (pnodeStrTemplate->super_ParseNode).location;
      pPVar5 = ParseNode::AsParseNodeBin(this_00);
      Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,Ld_A,RVar1,pPVar5->pnode1->location);
      pPVar5 = ParseNode::AsParseNodeBin(this_00);
      FuncInfo::ReleaseLoc(funcInfo,pPVar5->pnode1);
      bVar3 = false;
    }
    if (this_00->nop == knopList) {
      this_01 = pnodeStrTemplate->pnodeSubstitutionExpressions;
      this = &byteCodeGenerator->m_writer;
      do {
        pPVar7 = this_01;
        if (this_01->nop == knopList) {
          pPVar5 = ParseNode::AsParseNodeBin(this_01);
          pPVar7 = pPVar5->pnode1;
          pPVar5 = ParseNode::AsParseNodeBin(this_01);
          this_01 = pPVar5->pnode2;
        }
        Emit(pPVar7,byteCodeGenerator,funcInfo,0,false,false);
        if (bVar3) {
          Js::ByteCodeWriter::Reg2
                    (this,Conv_Str,(pnodeStrTemplate->super_ParseNode).location,pPVar7->location);
          bVar3 = false;
        }
        else {
          R0 = FuncInfo::AcquireTmpRegister(funcInfo);
          Js::ByteCodeWriter::Reg2(this,Conv_Str,R0,pPVar7->location);
          RVar1 = (pnodeStrTemplate->super_ParseNode).location;
          Js::ByteCodeWriter::Reg3(this,Add_A,RVar1,RVar1,R0);
          FuncInfo::ReleaseTmpRegister(funcInfo,R0);
        }
        FuncInfo::ReleaseLoc(funcInfo,pPVar7);
        pPVar5 = ParseNode::AsParseNodeBin(this_00);
        this_00 = pPVar5->pnode2;
        pPVar7 = this_00;
        if (this_00->nop == knopList) {
          pPVar5 = ParseNode::AsParseNodeBin(this_00);
          pPVar7 = pPVar5->pnode1;
        }
        pPVar6 = ParseNode::AsParseNodeStr(pPVar7);
        if (pPVar6->pid->m_cch != 0) {
          Emit(pPVar7,byteCodeGenerator,funcInfo,0,false,false);
          RVar1 = (pnodeStrTemplate->super_ParseNode).location;
          Js::ByteCodeWriter::Reg3(this,Add_A,RVar1,RVar1,pPVar7->location);
          FuncInfo::ReleaseLoc(funcInfo,pPVar7);
        }
      } while (this_00->nop == knopList);
    }
  }
  return;
}

Assistant:

void EmitStringTemplate(ParseNodeStrTemplate *pnodeStrTemplate, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    Assert(pnodeStrTemplate->pnodeStringLiterals);

    // For a tagged string template, we will create the callsite constant object as part of the FunctionBody constants table.
    // We only need to emit code for non-tagged string templates here.
    if (!pnodeStrTemplate->isTaggedTemplate)
    {
        // If we have no substitutions and this is not a tagged template, we can emit just the single cooked string.
        if (pnodeStrTemplate->pnodeSubstitutionExpressions == nullptr)
        {
            Assert(pnodeStrTemplate->pnodeStringLiterals->nop != knopList);

            funcInfo->AcquireLoc(pnodeStrTemplate);
            Emit(pnodeStrTemplate->pnodeStringLiterals, byteCodeGenerator, funcInfo, false);

            Assert(pnodeStrTemplate->location != pnodeStrTemplate->pnodeStringLiterals->location);

            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, pnodeStrTemplate->location, pnodeStrTemplate->pnodeStringLiterals->location);
            funcInfo->ReleaseLoc(pnodeStrTemplate->pnodeStringLiterals);
        }
        else
        {
            // If we have substitutions but no tag function, we can skip the callSite object construction (and also ignore raw strings).
            funcInfo->AcquireLoc(pnodeStrTemplate);

            // First string must be a list node since we have substitutions.
            AssertMsg(pnodeStrTemplate->pnodeStringLiterals->nop == knopList, "First string in the list must be a knopList node.");

            ParseNode* stringNodeList = pnodeStrTemplate->pnodeStringLiterals;

            // Emit the first string and load that into the pnode location.
            // skip loading the string if it is empty
            ParseNode* firstString = stringNodeList->AsParseNodeBin()->pnode1;
            bool skippedFirst = false;
            if (firstString->AsParseNodeStr()->pid->Cch() == 0)
            {
                skippedFirst = true;
            }
            else
            {
                Emit(stringNodeList->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);

                Assert(pnodeStrTemplate->location != stringNodeList->AsParseNodeBin()->pnode1->location);

                byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, pnodeStrTemplate->location, stringNodeList->AsParseNodeBin()->pnode1->location);
                funcInfo->ReleaseLoc(stringNodeList->AsParseNodeBin()->pnode1);
            }


            ParseNode* expressionNodeList = pnodeStrTemplate->pnodeSubstitutionExpressions;
            ParseNode* stringNode;
            ParseNode* expressionNode;

            // Now append the substitution expressions and remaining string constants via normal add operator
            // We will always have one more string constant than substitution expression
            // `strcon1 ${expr1} strcon2 ${expr2} strcon3` = strcon1 + expr1 + strcon2 + expr2 + strcon3
            //
            // strcon1 --- step 1 (above)
            // expr1   \__ step 2
            // strcon2 /
            // expr2   \__ step 3
            // strcon3 /
            while (stringNodeList->nop == knopList)
            {
                // If the current head of the expression list is a list, fetch the node and walk the list.
                if (expressionNodeList->nop == knopList)
                {
                    expressionNode = expressionNodeList->AsParseNodeBin()->pnode1;
                    expressionNodeList = expressionNodeList->AsParseNodeBin()->pnode2;
                }
                else
                {
                    // This is the last element of the expression list.
                    expressionNode = expressionNodeList;
                }

                // Emit the expression and append it to the string we're building.
                Emit(expressionNode, byteCodeGenerator, funcInfo, false);

                // if this is the first expression AND the initial string was empty write directly to the pnodeStrTemplate location
                if (skippedFirst == true)
                {
                    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Conv_Str, pnodeStrTemplate->location, expressionNode->location);
                    skippedFirst = false;
                }
                else
                {
                    Js::RegSlot toStringLocation = funcInfo->AcquireTmpRegister();
                    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Conv_Str, toStringLocation, expressionNode->location);
                    byteCodeGenerator->Writer()->Reg3(Js::OpCode::Add_A, pnodeStrTemplate->location, pnodeStrTemplate->location, toStringLocation);
                    funcInfo->ReleaseTmpRegister(toStringLocation);
                }

                funcInfo->ReleaseLoc(expressionNode);

                // Move to the next string in the list - we already got ahead of the expressions in the first string literal above.
                stringNodeList = stringNodeList->AsParseNodeBin()->pnode2;

                // If the current head of the string literal list is also a list node, need to fetch the actual string literal node.
                if (stringNodeList->nop == knopList)
                {
                    stringNode = stringNodeList->AsParseNodeBin()->pnode1;
                }
                else
                {
                    // This is the last element of the string literal list.
                    stringNode = stringNodeList;
                }

                // Emit the string node following the previous expression and append it to the string.
                // This is either just some string in the list or it is the last string.
                if (stringNode->AsParseNodeStr()->pid->Cch() != 0)
                {
                    Emit(stringNode, byteCodeGenerator, funcInfo, false);
                    byteCodeGenerator->Writer()->Reg3(Js::OpCode::Add_A, pnodeStrTemplate->location, pnodeStrTemplate->location, stringNode->location);
                    funcInfo->ReleaseLoc(stringNode);
                }
            }
        }
    }
}